

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCGSolver.cpp
# Opt level: O0

int __thiscall
amrex::MLCGSolver::solve_cg(MLCGSolver *this,MultiFab *sol,MultiFab *rhs,Real eps_rel,Real eps_abs)

{
  bool bVar1;
  undefined8 in_RDX;
  FabArrayBase *in_RSI;
  char *in_RDI;
  double in_XMM0_Qa;
  Real RVar2;
  Real RVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  IntVect IVar4;
  Real pw;
  Real alpha;
  Real beta;
  Real rho;
  int ret;
  Real rho_1;
  Real rnorm0;
  Real rnorm;
  MultiFab q;
  MultiFab z;
  MultiFab r;
  MultiFab sorig;
  MultiFab p;
  FabFactory<amrex::FArrayBox> *factory;
  DistributionMapping *dm;
  BoxArray *ba;
  int ncomp;
  FabFactory<amrex::FArrayBox> *pFVar5;
  MultiFab *yy;
  undefined4 uVar6;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffed10;
  Print *this_00;
  Print *in_stack_ffffffffffffed18;
  Print *in_stack_ffffffffffffed20;
  MFInfo *in_stack_ffffffffffffed28;
  MLCGSolver *in_stack_ffffffffffffed30;
  int in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  Print *in_stack_ffffffffffffed40;
  BoxArray *in_stack_ffffffffffffed48;
  MultiFab *in_stack_ffffffffffffed50;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffed60;
  Print *in_stack_ffffffffffffed80;
  int local_aa4;
  Real local_900;
  undefined1 local_8c8 [384];
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined1 local_568 [384];
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  int local_1f8 [3];
  undefined8 local_1e8;
  int local_1e0;
  undefined1 local_1d8 [384];
  FabFactory<amrex::FArrayBox> *local_58;
  DistributionMapping *local_50;
  BoxArray *local_48;
  int local_3c;
  double local_38;
  double local_30;
  undefined8 local_28;
  FabArrayBase *local_20;
  int local_c;
  char *local_8;
  
  local_38 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_30 = in_XMM0_Qa;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_3c = FabArrayBase::nComp(in_RSI);
  local_48 = FabArrayBase::boxArray(local_20);
  local_50 = FabArrayBase::DistributionMap(local_20);
  local_58 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x12afeec);
  IVar4 = FabArrayBase::nGrowVect(local_20);
  local_1f8[2] = IVar4.vect[2];
  local_1e0 = local_1f8[2];
  local_1f8._0_8_ = IVar4.vect._0_8_;
  local_1e8._0_4_ = local_1f8[0];
  local_1e8._4_4_ = local_1f8[1];
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_208 = 0;
  local_1f8 = IVar4.vect;
  MFInfo::MFInfo((MFInfo *)0x12aff90);
  pFVar5 = local_58;
  MultiFab::MultiFab(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
                     (DistributionMapping *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c,
                     (IntVect *)in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,
                     in_stack_ffffffffffffed60);
  MFInfo::~MFInfo((MFInfo *)0x12affe1);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_ffffffffffffed10,(value_type)pFVar5);
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3c8 = 0;
  MFInfo::MFInfo((MFInfo *)0x12b0067);
  MultiFab::MultiFab(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
                     (DistributionMapping *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c,
                     in_stack_ffffffffffffed38,(MFInfo *)in_stack_ffffffffffffed30,
                     in_stack_ffffffffffffed60);
  MFInfo::~MFInfo((MFInfo *)0x12b00b8);
  local_588 = 0;
  uStack_580 = 0;
  local_598 = 0;
  uStack_590 = 0;
  local_578 = 0;
  MFInfo::MFInfo((MFInfo *)0x12b012c);
  MultiFab::MultiFab(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
                     (DistributionMapping *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c,
                     in_stack_ffffffffffffed38,(MFInfo *)in_stack_ffffffffffffed30,
                     in_stack_ffffffffffffed60);
  MFInfo::~MFInfo((MFInfo *)0x12b017d);
  local_738 = 0;
  uStack_730 = 0;
  local_748 = 0;
  uStack_740 = 0;
  local_728 = 0;
  MFInfo::MFInfo((MFInfo *)0x12b01f1);
  MultiFab::MultiFab(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
                     (DistributionMapping *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c,
                     in_stack_ffffffffffffed38,(MFInfo *)in_stack_ffffffffffffed30,
                     in_stack_ffffffffffffed60);
  MFInfo::~MFInfo((MFInfo *)0x12b0242);
  MFInfo::MFInfo((MFInfo *)0x12b02b6);
  pFVar5 = local_58;
  MultiFab::MultiFab(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
                     (DistributionMapping *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c,
                     in_stack_ffffffffffffed38,(MFInfo *)in_stack_ffffffffffffed30,
                     in_stack_ffffffffffffed60);
  MFInfo::~MFInfo((MFInfo *)0x12b0307);
  MultiFab::Copy((MultiFab *)in_stack_ffffffffffffed40,
                 (MultiFab *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                 (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),(int)in_stack_ffffffffffffed30,
                 (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),(int)in_stack_ffffffffffffed28);
  this_00 = (Print *)0x0;
  yy = (MultiFab *)((ulong)pFVar5 & 0xffffffff00000000);
  (**(code **)(**(long **)(in_RDI + 8) + 0x88))
            (*(long **)(in_RDI + 8),*(undefined4 *)(in_RDI + 0x14),*(undefined4 *)(in_RDI + 0x18),
             local_568,local_20,local_28);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)this_00,(value_type)yy);
  RVar2 = norm_inf((MLCGSolver *)in_stack_ffffffffffffed40,
                   (MultiFab *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                   SUB81((ulong)in_stack_ffffffffffffed30 >> 0x38,0));
  if (0 < *(int *)(in_RDI + 0x1c)) {
    OutStream();
    Print::Print(in_stack_ffffffffffffed40,
                 (ostream *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
    Print::operator<<(this_00,(char (*) [48])yy);
    Print::operator<<(this_00,(double *)yy);
    Print::operator<<(this_00,(char *)yy);
    Print::~Print(in_stack_ffffffffffffed80);
  }
  local_aa4 = 0;
  in_RDI[0x28] = '\x01';
  in_RDI[0x29] = '\0';
  in_RDI[0x2a] = '\0';
  in_RDI[0x2b] = '\0';
  if (((RVar2 == 0.0) && (!NAN(RVar2))) || (local_900 = RVar2, RVar2 < local_38)) {
    if (0 < *(int *)(in_RDI + 0x1c)) {
      OutStream();
      Print::Print(in_stack_ffffffffffffed40,
                   (ostream *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
      Print::operator<<(this_00,(char (*) [26])yy);
      Print::operator<<(this_00,(char (*) [11])yy);
      Print::operator<<(this_00,(double *)yy);
      Print::operator<<(this_00,(char (*) [13])yy);
      Print::operator<<(this_00,(double *)yy);
      Print::operator<<(this_00,(_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                                 *)yy);
      Print::~Print(in_stack_ffffffffffffed80);
    }
  }
  else {
    while (*(int *)(in_RDI + 0x28) <= *(int *)(in_RDI + 0x20)) {
      MultiFab::Copy((MultiFab *)in_stack_ffffffffffffed40,
                     (MultiFab *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                     (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),(int)in_stack_ffffffffffffed30,
                     (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),(int)in_stack_ffffffffffffed28)
      ;
      RVar3 = dotxy(in_stack_ffffffffffffed30,(MultiFab *)in_stack_ffffffffffffed28,
                    (MultiFab *)in_stack_ffffffffffffed20,
                    SUB81((ulong)in_stack_ffffffffffffed18 >> 0x38,0));
      if ((RVar3 == 0.0) && (!NAN(RVar3))) {
        local_aa4 = 1;
        break;
      }
      if (*(int *)(in_RDI + 0x28) == 1) {
        MultiFab::Copy((MultiFab *)in_stack_ffffffffffffed40,
                       (MultiFab *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                       (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),
                       (int)in_stack_ffffffffffffed30,
                       (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
                       (int)in_stack_ffffffffffffed28);
        uVar6 = (undefined4)((ulong)yy >> 0x20);
      }
      else {
        anon_unknown_32::sxay
                  ((MultiFab *)in_stack_ffffffffffffed20,(MultiFab *)in_stack_ffffffffffffed18,
                   (Real)this_00,yy,0);
        uVar6 = (undefined4)((ulong)yy >> 0x20);
      }
      this_00 = (Print *)0x0;
      yy = (MultiFab *)CONCAT44(uVar6,1);
      (**(code **)(**(long **)(in_RDI + 8) + 0x68))
                (*(long **)(in_RDI + 8),*(undefined4 *)(in_RDI + 0x14),
                 *(undefined4 *)(in_RDI + 0x18),local_8c8,local_1d8,0);
      RVar3 = dotxy(in_stack_ffffffffffffed30,(MultiFab *)in_stack_ffffffffffffed28,
                    (MultiFab *)in_stack_ffffffffffffed20,
                    SUB81((ulong)in_stack_ffffffffffffed18 >> 0x38,0));
      if ((RVar3 == 0.0) && (!NAN(RVar3))) {
        local_aa4 = 1;
        break;
      }
      if (2 < *(int *)(in_RDI + 0x1c)) {
        OutStream();
        Print::Print(in_stack_ffffffffffffed40,
                     (ostream *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        Print::operator<<(this_00,(char (*) [15])yy);
        Print::operator<<(this_00,(char (*) [7])yy);
        Print::operator<<(this_00,(int *)yy);
        Print::operator<<(this_00,(char (*) [6])yy);
        Print::operator<<(this_00,(double *)yy);
        Print::operator<<(this_00,(char (*) [8])yy);
        Print::operator<<(this_00,(double *)yy);
        Print::operator<<(this_00,(char *)yy);
        Print::~Print(in_stack_ffffffffffffed80);
      }
      anon_unknown_32::sxay
                ((MultiFab *)in_stack_ffffffffffffed20,(MultiFab *)in_stack_ffffffffffffed18,
                 (Real)this_00,yy,0);
      anon_unknown_32::sxay
                ((MultiFab *)in_stack_ffffffffffffed20,(MultiFab *)in_stack_ffffffffffffed18,
                 (Real)this_00,yy,0);
      local_900 = norm_inf((MLCGSolver *)in_stack_ffffffffffffed40,
                           (MultiFab *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38)
                           ,SUB81((ulong)in_stack_ffffffffffffed30 >> 0x38,0));
      if (2 < *(int *)(in_RDI + 0x1c)) {
        in_stack_ffffffffffffed80 = (Print *)OutStream();
        Print::Print(in_stack_ffffffffffffed40,
                     (ostream *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        Print::operator<<(this_00,(char (*) [31])yy);
        std::setw(4);
        Print::operator<<(in_stack_ffffffffffffed20,(_Setw *)in_stack_ffffffffffffed18);
        Print::operator<<(this_00,(int *)yy);
        Print::operator<<(this_00,(char (*) [12])yy);
        Print::operator<<(this_00,(double *)yy);
        Print::operator<<(this_00,(char *)yy);
        Print::~Print(in_stack_ffffffffffffed80);
      }
      if ((local_900 < local_30 * RVar2) || (local_900 < local_38)) break;
      *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
    }
    if (0 < *(int *)(in_RDI + 0x1c)) {
      OutStream();
      Print::Print(in_stack_ffffffffffffed40,
                   (ostream *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
      Print::operator<<(this_00,(char (*) [31])yy);
      std::setw(4);
      Print::operator<<(in_stack_ffffffffffffed20,(_Setw *)in_stack_ffffffffffffed18);
      Print::operator<<(this_00,(int *)yy);
      in_stack_ffffffffffffed20 = Print::operator<<(this_00,(char (*) [12])yy);
      in_stack_ffffffffffffed18 = Print::operator<<(this_00,(double *)yy);
      Print::operator<<(this_00,(char *)yy);
      Print::~Print(in_stack_ffffffffffffed80);
    }
    if (((local_aa4 == 0) && (local_30 * RVar2 < local_900)) && (local_38 < local_900)) {
      if ((0 < *(int *)(in_RDI + 0x1c)) && (bVar1 = ParallelDescriptor::IOProcessor(), bVar1)) {
        local_8 = "MLCGSolver_cg: failed to converge!";
        Warning_host(in_RDI);
      }
      local_aa4 = 8;
    }
    if (((local_aa4 != 0) && (local_aa4 != 8)) || (RVar2 <= local_900)) {
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)this_00,(value_type)yy);
      MultiFab::plus((MultiFab *)in_stack_ffffffffffffed20,(MultiFab *)in_stack_ffffffffffffed18,
                     (int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)yy >> 0x20));
    }
    else {
      MultiFab::plus((MultiFab *)in_stack_ffffffffffffed20,(MultiFab *)in_stack_ffffffffffffed18,
                     (int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)yy >> 0x20));
    }
  }
  local_c = local_aa4;
  MultiFab::~MultiFab((MultiFab *)0x12b0f3d);
  MultiFab::~MultiFab((MultiFab *)0x12b0f4a);
  MultiFab::~MultiFab((MultiFab *)0x12b0f57);
  MultiFab::~MultiFab((MultiFab *)0x12b0f64);
  MultiFab::~MultiFab((MultiFab *)0x12b0f71);
  return local_c;
}

Assistant:

int
MLCGSolver::solve_cg (MultiFab&       sol,
                      const MultiFab& rhs,
                      Real            eps_rel,
                      Real            eps_abs)
{
    BL_PROFILE("MLCGSolver::cg");

    const int ncomp = sol.nComp();

    const BoxArray& ba = sol.boxArray();
    const DistributionMapping& dm = sol.DistributionMap();
    const auto& factory = sol.Factory();

    MultiFab p(ba, dm, ncomp, sol.nGrowVect(), MFInfo(), factory);
    p.setVal(0.0);

    MultiFab sorig(ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab r    (ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab z    (ba, dm, ncomp, nghost, MFInfo(), factory);
    MultiFab q    (ba, dm, ncomp, nghost, MFInfo(), factory);

    MultiFab::Copy(sorig,sol,0,0,ncomp,nghost);

    Lp.correctionResidual(amrlev, mglev, r, sol, rhs, MLLinOp::BCMode::Homogeneous);

    sol.setVal(0);

    Real       rnorm    = norm_inf(r);
    const Real rnorm0   = rnorm;

    if ( verbose > 0 )
    {
        amrex::Print() << "MLCGSolver_CG: Initial error (error0) :        " << rnorm0 << '\n';
    }

    Real rho_1 = 0;
    int  ret = 0;
    iter = 1;

    if ( rnorm0 == 0 || rnorm0 < eps_abs )
    {
        if ( verbose > 0 ) {
            amrex::Print() << "MLCGSolver_CG: niter = 0,"
                           << ", rnorm = " << rnorm
                           << ", eps_abs = " << eps_abs << std::endl;
        }
        return ret;
    }

    for (; iter <= maxiter; ++iter)
    {
        MultiFab::Copy(z,r,0,0,ncomp,nghost);

        Real rho = dotxy(z,r);

        if ( rho == 0 )
        {
            ret = 1; break;
        }
        if (iter == 1)
        {
            MultiFab::Copy(p,z,0,0,ncomp,nghost);
        }
        else
        {
            Real beta = rho/rho_1;
            sxay(p, z, beta, p, nghost);
        }
        Lp.apply(amrlev, mglev, q, p, MLLinOp::BCMode::Homogeneous, MLLinOp::StateMode::Correction);

        Real alpha;
        Real pw = dotxy(p,q);
        if ( pw != Real(0.0))
        {
            alpha = rho/pw;
        }
        else
        {
            ret = 1; break;
        }

        if ( verbose > 2 )
        {
            amrex::Print() << "MLCGSolver_cg:"
                           << " iter " << iter
                           << " rho " << rho
                           << " alpha " << alpha << '\n';
        }
        sxay(sol, sol, alpha, p, nghost);
        sxay(  r,   r,-alpha, q, nghost);
        rnorm = norm_inf(r);

        if ( verbose > 2 )
        {
            amrex::Print() << "MLCGSolver_cg:       Iteration"
                           << std::setw(4) << iter
                           << " rel. err. "
                           << rnorm/(rnorm0) << '\n';
        }

        if ( rnorm < eps_rel*rnorm0 || rnorm < eps_abs ) break;

        rho_1 = rho;
    }

    if ( verbose > 0 )
    {
        amrex::Print() << "MLCGSolver_cg: Final Iteration"
                       << std::setw(4) << iter
                       << " rel. err. "
                       << rnorm/(rnorm0) << '\n';
    }

    if ( ret == 0 &&  rnorm > eps_rel*rnorm0 && rnorm > eps_abs )
    {
        if ( verbose > 0 && ParallelDescriptor::IOProcessor() )
            amrex::Warning("MLCGSolver_cg: failed to converge!");
        ret = 8;
    }

    if ( ( ret == 0 || ret == 8 ) && (rnorm < rnorm0) )
    {
        sol.plus(sorig, 0, ncomp, nghost);
    }
    else
    {
        sol.setVal(0);
        sol.plus(sorig, 0, ncomp, nghost);
    }

    return ret;
}